

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf_impl.cpp
# Opt level: O0

int32_t utf8_appendCharSafeBody_63(uint8_t *s,int32_t i,int32_t length,UChar32 c,UBool *pIsError)

{
  uint uVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  byte *pbVar5;
  int local_34;
  uint32_t __uc;
  int32_t offset;
  UBool *pIsError_local;
  int local_20;
  UChar32 c_local;
  int32_t length_local;
  int32_t i_local;
  uint8_t *s_local;
  
  bVar2 = (byte)(c >> 6);
  bVar4 = (byte)c;
  if ((uint)c < 0x800) {
    if (i + 1 < length) {
      s[i] = bVar2 | 0xc0;
      s[i + 1] = bVar4 & 0x3f | 0x80;
      return i + 2;
    }
  }
  else {
    bVar3 = (byte)(c >> 0xc);
    if ((uint)c < 0x10000) {
      if ((i + 2 < length) && ((c & 0xfffff800U) != 0xd800)) {
        s[i] = bVar3 | 0xe0;
        s[i + 1] = bVar2 & 0x3f | 0x80;
        s[i + 2] = bVar4 & 0x3f | 0x80;
        return i + 3;
      }
    }
    else if (((uint)c < 0x110000) && (i + 3 < length)) {
      s[i] = (byte)(c >> 0x12) | 0xf0;
      s[i + 1] = bVar3 & 0x3f | 0x80;
      s[i + 2] = bVar2 & 0x3f | 0x80;
      s[i + 3] = bVar4 & 0x3f | 0x80;
      return i + 4;
    }
  }
  c_local = i;
  if (pIsError == (UBool *)0x0) {
    local_20 = length - i;
    if (0 < local_20) {
      if (3 < local_20) {
        local_20 = 3;
      }
      pbVar5 = s + i;
      uVar1 = utf8_errorValue[local_20 + -1];
      if (uVar1 < 0x80) {
        *pbVar5 = (byte)uVar1;
        local_34 = 1;
      }
      else {
        if (uVar1 < 0x800) {
          *pbVar5 = (byte)(uVar1 >> 6) | 0xc0;
          local_34 = 1;
        }
        else {
          if (uVar1 < 0x10000) {
            local_34 = 1;
            *pbVar5 = (byte)(uVar1 >> 0xc) | 0xe0;
          }
          else {
            *pbVar5 = (byte)(uVar1 >> 0x12) | 0xf0;
            local_34 = 2;
            pbVar5[1] = (byte)(uVar1 >> 0xc) & 0x3f | 0x80;
          }
          pbVar5[local_34] = (byte)(uVar1 >> 6) & 0x3f | 0x80;
          local_34 = local_34 + 1;
        }
        pbVar5[local_34] = (byte)uVar1 & 0x3f | 0x80;
        local_34 = local_34 + 1;
      }
      c_local = i + local_34;
    }
  }
  else {
    *pIsError = '\x01';
  }
  return c_local;
}

Assistant:

U_CAPI int32_t U_EXPORT2
utf8_appendCharSafeBody(uint8_t *s, int32_t i, int32_t length, UChar32 c, UBool *pIsError) {
    if((uint32_t)(c)<=0x7ff) {
        if((i)+1<(length)) {
            (s)[(i)++]=(uint8_t)(((c)>>6)|0xc0);
            (s)[(i)++]=(uint8_t)(((c)&0x3f)|0x80);
            return i;
        }
    } else if((uint32_t)(c)<=0xffff) {
        /* Starting with Unicode 3.2, surrogate code points must not be encoded in UTF-8. */
        if((i)+2<(length) && !U_IS_SURROGATE(c)) {
            (s)[(i)++]=(uint8_t)(((c)>>12)|0xe0);
            (s)[(i)++]=(uint8_t)((((c)>>6)&0x3f)|0x80);
            (s)[(i)++]=(uint8_t)(((c)&0x3f)|0x80);
            return i;
        }
    } else if((uint32_t)(c)<=0x10ffff) {
        if((i)+3<(length)) {
            (s)[(i)++]=(uint8_t)(((c)>>18)|0xf0);
            (s)[(i)++]=(uint8_t)((((c)>>12)&0x3f)|0x80);
            (s)[(i)++]=(uint8_t)((((c)>>6)&0x3f)|0x80);
            (s)[(i)++]=(uint8_t)(((c)&0x3f)|0x80);
            return i;
        }
    }
    /* c>0x10ffff or not enough space, write an error value */
    if(pIsError!=NULL) {
        *pIsError=TRUE;
    } else {
        length-=i;
        if(length>0) {
            int32_t offset;
            if(length>3) {
                length=3;
            }
            s+=i;
            offset=0;
            c=utf8_errorValue[length-1];
            U8_APPEND_UNSAFE(s, offset, c);
            i=i+offset;
        }
    }
    return i;
}